

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_unpk_16_rr(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *r_dst;
  uint src;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_cpu.dar[m68ki_cpu.ir & 7];
    uVar3 = m68ki_cpu.ir >> 9;
    uVar2 = m68ki_cpu.dar[uVar3 & 7];
    uVar4 = m68ki_read_imm_16();
    m68ki_cpu.dar[uVar3 & 7] =
         uVar2 & 0xffff0000 | ((uVar1 & 0xf0) << 4 | uVar1 & 0xf) + uVar4 & 0xffff;
  }
  return;
}

Assistant:

static void m68k_op_unpk_16_rr(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: DX and DY are reversed in Motorola's docs */
		uint src = DY;
		uint* r_dst = &DX;

		*r_dst = MASK_OUT_BELOW_16(*r_dst) | (((((src << 4) & 0x0f00) | (src & 0x000f)) + OPER_I_16()) & 0xffff);
		return;
	}
	m68ki_exception_illegal();
}